

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::TestCaseInfo::TestCaseInfo
          (TestCaseInfo *this,ITestCase *testCase,string *className,string *name,string *description
          ,SourceLineInfo *lineInfo)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  allocator<char> local_71;
  string *local_70;
  string *local_68;
  undefined1 local_60 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  (this->m_test).m_p = testCase;
  if (testCase != (ITestCase *)0x0) {
    (*(testCase->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(testCase);
  }
  std::__cxx11::string::string((string *)&this->m_className,(string *)className);
  local_70 = &this->m_name;
  local_68 = &this->m_className;
  std::__cxx11::string::string((string *)local_70,(string *)name);
  std::__cxx11::string::string((string *)&this->m_description,(string *)description);
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_tags)._M_t._M_impl.super__Rb_tree_header;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  SourceLineInfo::SourceLineInfo(&this->m_lineInfo,lineInfo);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60,"./",&local_71);
  bVar2 = startsWith(name,(string *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  this->m_isHidden = bVar2;
  local_60._0_8_ = &PTR__TagExtracter_001b72d0;
  local_60._16_8_ = &local_40;
  local_60._24_8_ = 0;
  local_40._M_local_buf[0] = '\0';
  local_60._8_8_ = &this->m_tags;
  TagExtracter::parse((TagExtracter *)local_60,&this->m_description);
  TagExtracter::~TagExtracter((TagExtracter *)local_60);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60,"hide",&local_71);
  bVar2 = hasTag(this,(string *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  if (bVar2) {
    this->m_isHidden = true;
  }
  return;
}

Assistant:

TestCaseInfo::TestCaseInfo( ITestCase* testCase,
                                const std::string& className,
                                const std::string& name,
                                const std::string& description,
                                const SourceLineInfo& lineInfo )
    :   m_test( testCase ),
        m_className( className ),
        m_name( name ),
        m_description( description ),
        m_lineInfo( lineInfo ),
        m_isHidden( startsWith( name, "./" ) )
    {
        TagExtracter( m_tags ).parse( m_description );
        if( hasTag( "hide" ) )
            m_isHidden = true;
    }